

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-escape.c
# Opt level: O2

_Bool borg_recall(void)

{
  int iVar1;
  int iVar2;
  _Bool _Var3;
  keycode_t k;
  char *what;
  
  if ((borg.goal.recalling != L'\0') ||
     ((((_Var3 = borg_zap_rod(sv_rod_recall), !_Var3 &&
        (_Var3 = borg_activate_item(act_recall), !_Var3)) &&
       (_Var3 = borg_spell_fail(WORD_OF_RECALL,L'<'), !_Var3)) &&
      (_Var3 = borg_read_scroll(sv_scroll_word_of_recall), !_Var3)))) {
    return false;
  }
  iVar1 = borg.trait[0x69];
  iVar2 = borg.trait[0x6a];
  if (iVar1 == 0 || iVar2 <= iVar1) goto LAB_001f6338;
  what = "# Not resetting recall depth.";
  if ((iVar2 - borg_depth_hunted_unique < 6) ||
     (9 < (uint)((iVar1 - borg_depth_hunted_unique) + 4U))) {
LAB_001f632a:
    k = 0x6e;
  }
  else {
    k = 0x79;
    if ((iVar1 - 0x50U < 0x14) && (borg_race_death[borg_sauron_id] != 0)) {
      what = "# Resetting recall depth.";
    }
    else if (borg.goal.fleeing_munchkin == false) {
      what = "# Not Resetting recall depth.";
      if ((99 < iVar1) && (borg.trait[0x6b] == 0)) goto LAB_001f632a;
      if (iVar2 != 99 || L'\x04' < borg_numb_live_unique) {
        what = "# Resetting recall depth.";
      }
      if (iVar2 == 99 && L'\x04' >= borg_numb_live_unique) {
        k = 0x6e;
      }
    }
    else {
      what = "# Resetting recall depth during munchkin mode.";
    }
  }
  borg_note(what);
  borg_keypress(k);
LAB_001f6338:
  borg_keypress(0xe000);
  return true;
}

Assistant:

bool borg_recall(void)
{
    /* Multiple "recall" fails */
    if (!borg.goal.recalling) {
        /* Try to "recall" */
        if (borg_zap_rod(sv_rod_recall) || borg_activate_item(act_recall)
            || borg_spell_fail(WORD_OF_RECALL, 60)
            || borg_read_scroll(sv_scroll_word_of_recall)) {

            /* do we need to answer "Set recall depth to current depth? [y/n]" */
            if (borg.trait[BI_CDEPTH] < borg.trait[BI_MAXDEPTH]
                && borg.trait[BI_CDEPTH] != 0) {

                int diff_max_from_desired_depth
                    = borg.trait[BI_MAXDEPTH] - borg_depth_hunted_unique;
                int diff_cur_from_desired_depth
                    = borg.trait[BI_CDEPTH] - borg_depth_hunted_unique;

                /* Reset max depth when current depth is way deeper (5) than the */
                /* third deepest unique. */
                if (diff_max_from_desired_depth > 5
                    && diff_cur_from_desired_depth <= 5
                    && diff_cur_from_desired_depth > -5) {
                    /* Special check on deep levels */
                    if (borg.trait[BI_CDEPTH] >= 80 && borg.trait[BI_CDEPTH] < 100
                        && /* Deep */
                        borg_race_death[borg_sauron_id] != 0) /* Sauron is Dead */
                    {
                        /* Do reset Depth */
                        borg_note("# Resetting recall depth.");
                        borg_keypress('y');
                    }
                    else if (borg.goal.fleeing_munchkin == true) {
                        /* Do reset Depth */
                        borg_note("# Resetting recall depth during munchkin mode.");
                        borg_keypress('y');
                    }
                    else if (borg.trait[BI_CDEPTH] >= 100
                        && !borg.trait[BI_KING]) {
                        /* Do not reset Depth */
                        borg_note("# Not Resetting recall depth.");
                        borg_keypress('n');
                    }
                    else if (borg.trait[BI_MAXDEPTH] == 99
                        && borg_numb_live_unique < 5) {
                        /* Do reset Depth, cleaning up last uniques to hit */
                        /* Morgoth.  Want to keep using up the stock of potions */
                        borg_note("# Not Resetting recall depth.");
                        borg_keypress('n');
                    }
                    else {
                        /* Do reset Depth */
                        borg_note("# Resetting recall depth.");
                        borg_keypress('y');
                    }
                }
                /* reset recall depth in dungeon? */
                else {
                    /* Do not reset Depth */
                    borg_note("# Not resetting recall depth.");
                    borg_keypress('n');
                }
            }

            borg_keypress(ESCAPE);

            /* Success */
            return true;
        }
    }

    /* Nothing */
    return false;
}